

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O3

int magma_cipher_do_ctr(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  byte *out_00;
  byte *in_00;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  lVar3 = EVP_CIPHER_CTX_get_cipher_data();
  out_00 = (byte *)EVP_CIPHER_CTX_buf_noconst(ctx);
  in_00 = (byte *)EVP_CIPHER_CTX_iv_noconst(ctx);
  uVar2 = EVP_CIPHER_CTX_get_num(ctx);
  uVar5 = inl;
  if (inl != 0 && (uVar2 & 7) != 0) {
    lVar4 = 0;
    do {
      out[lVar4] = out_00[lVar4 + (ulong)(uVar2 & 7)] ^ in[lVar4];
      lVar1 = lVar4 + 1;
      if ((uVar2 + (int)lVar4 + 1 & 7) == 0) break;
      bVar7 = inl - 1 != lVar4;
      lVar4 = lVar1;
    } while (bVar7);
    in = in + lVar1;
    out = out + lVar1;
    uVar2 = uVar2 + (int)lVar1;
    uVar5 = inl - lVar1;
  }
  if (7 < uVar5) {
    uVar6 = 0;
    do {
      if (*(int *)(lVar3 + 8) - 1U < uVar2) {
        acpkm_magma_key_meshing((gost_ctx *)(lVar3 + 0x1c));
        uVar2 = uVar2 & 7;
      }
      magmacrypt((gost_ctx *)(lVar3 + 0x1c),in_00,out_00);
      lVar4 = 0;
      do {
        out[lVar4] = in[lVar4] ^ out_00[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      inc_counter(in_00,8);
      *(int *)(lVar3 + 4) = *(int *)(lVar3 + 4) + 8;
      in = in + 8;
      out = out + 8;
      uVar2 = uVar2 + 8;
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar5 >> 3);
    uVar5 = (ulong)((uint)uVar5 & 7);
  }
  if (uVar5 != 0) {
    if (*(int *)(lVar3 + 8) - 1U < uVar2) {
      acpkm_magma_key_meshing((gost_ctx *)(lVar3 + 0x1c));
      uVar2 = uVar2 & 7;
    }
    magmacrypt((gost_ctx *)(lVar3 + 0x1c),in_00,out_00);
    uVar6 = 0;
    do {
      out[uVar6] = in[uVar6] ^ out_00[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
    inc_counter(in_00,8);
    *(int *)(lVar3 + 4) = *(int *)(lVar3 + 4) + 8;
    uVar2 = uVar2 + (int)uVar5;
  }
  EVP_CIPHER_CTX_set_num(ctx,uVar2);
  return (int)inl;
}

Assistant:

static int magma_cipher_do_ctr(EVP_CIPHER_CTX *ctx, unsigned char *out,
                               const unsigned char *in, size_t inl)
{
    const unsigned char *in_ptr = in;
    unsigned char *out_ptr = out;
    size_t j;
    struct ossl_gost_cipher_ctx *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
    unsigned char *buf = EVP_CIPHER_CTX_buf_noconst(ctx);
    unsigned char *iv = EVP_CIPHER_CTX_iv_noconst(ctx);
    unsigned int num = EVP_CIPHER_CTX_num(ctx);
    size_t blocks, i, lasted = inl;
/* Process partial blocks */
    while ((num & MAGMA_BLOCK_MASK) && lasted) {
        *out_ptr++ = *in_ptr++ ^ buf[num & MAGMA_BLOCK_MASK];
        --lasted;
        num++;
    }
    blocks = lasted / MAGMA_BLOCK_SIZE;

/* Process full blocks */
    for (i = 0; i < blocks; i++) {
        apply_acpkm_magma(c, &num);
        magmacrypt(&(c->cctx), iv, buf);
        for (j = 0; j < 8; j++) {
            out_ptr[j] = buf[j] ^ in_ptr[j];
        }
        ctr64_inc(iv);
        c->count += MAGMA_BLOCK_SIZE;
        in_ptr += MAGMA_BLOCK_SIZE;
        out_ptr += MAGMA_BLOCK_SIZE;
        num += MAGMA_BLOCK_SIZE;
        lasted -= MAGMA_BLOCK_SIZE;
    }

/* Process the rest of plaintext */
    if (lasted > 0) {
        apply_acpkm_magma(c, &num);
        magmacrypt(&(c->cctx), iv, buf);

        for (i = 0; i < lasted; i++)
            out_ptr[i] = buf[i] ^ in_ptr[i];
        ctr64_inc(iv);
        c->count += 8;
        num += lasted;
    }
    EVP_CIPHER_CTX_set_num(ctx, num);

    return inl;
}